

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execDivuMusashi<(moira::Core)0,(moira::Instr)55,(moira::Mode)2,2>
          (Moira *this,u16 opcode,bool *divByZero)

{
  u32 uVar1;
  u32 dividend;
  u32 result;
  u32 divisor;
  u32 ea;
  i64 c;
  int dst;
  int src;
  bool *divByZero_local;
  Moira *pMStack_10;
  u16 opcode_local;
  Moira *this_local;
  
  c._4_4_ = opcode & 7;
  c._0_4_ = (int)(uint)opcode >> 9 & 7;
  _divisor = this->clock;
  _dst = divByZero;
  divByZero_local._6_2_ = opcode;
  pMStack_10 = this;
  readOp<(moira::Core)0,(moira::Mode)2,2,0ull>(this,c._4_4_,&result,&dividend);
  if (dividend == 0) {
    execException<(moira::Core)0>(this,DIVIDE_BY_ZERO,0);
    *_dst = true;
  }
  else {
    uVar1 = readD<4>(this,(uint)c);
    uVar1 = divuMusashi<(moira::Core)0>(this,uVar1,dividend);
    writeD<4>(this,(uint)c,uVar1);
    prefetch<(moira::Core)0,4ull>(this);
  }
  return;
}

Assistant:

void
Moira::execDivuMusashi(u16 opcode, bool *divByZero)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    [[maybe_unused]] i64 c = clock;
    u32 ea, divisor, result;
    readOp<C, M, Word>(src, &ea, &divisor);

    // Check for division by zero
    if (divisor == 0) {
        if constexpr (C == Core::C68000) {
            SYNC(8 - (int)(clock - c));
        } else {
            SYNC(10 - (int)(clock - c));
        }
        execException<C>(M68kException::DIVIDE_BY_ZERO);
        *divByZero = true;
        return;
    }

    u32 dividend = readD(dst);
    result = divuMusashi<C>(dividend, divisor);

    SYNC_68000(136);
    SYNC_68010(104);

    writeD(dst, result);
    prefetch<C, POLL>();
}